

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O3

double get_removal_time(int mode,int num_decoded_frame,int decoder_buffer_delay,
                       FRAME_BUFFER *frame_buffer_pool,double current_time)

{
  ulong uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  
  if (mode == 1) {
    return -1.0;
  }
  if (num_decoded_frame == 0) {
    return (double)decoder_buffer_delay / 90000.0;
  }
  uVar1 = 0;
  bVar2 = false;
  dVar3 = 1e+16;
  do {
    dVar4 = dVar3;
    if (frame_buffer_pool->decoder_ref_count == 0) {
      if (frame_buffer_pool->player_ref_count == 0) break;
      dVar4 = frame_buffer_pool->presentation_time;
      if (dVar4 < 0.0 || dVar3 <= dVar4) {
        dVar4 = dVar3;
      }
    }
    bVar2 = 8 < uVar1;
    uVar1 = uVar1 + 1;
    frame_buffer_pool = frame_buffer_pool + 1;
    dVar3 = dVar4;
  } while (uVar1 != 10);
  if (bVar2) {
    current_time = (double)(~-(ulong)(dVar4 < 1e+16) & 0xbff0000000000000 |
                           (ulong)dVar4 & -(ulong)(dVar4 < 1e+16));
  }
  return current_time;
}

Assistant:

static double get_removal_time(int mode, int num_decoded_frame,
                               int decoder_buffer_delay,
                               const FRAME_BUFFER *frame_buffer_pool,
                               double current_time) {
  if (mode == SCHEDULE_MODE) {
    assert(0 && "SCHEDULE_MODE IS NOT SUPPORTED YET");
    return INVALID_TIME;
  } else {
    return time_next_buffer_is_free(num_decoded_frame, decoder_buffer_delay,
                                    frame_buffer_pool, current_time);
  }
}